

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::Hashing::compute_hash_raytracing_pipeline
               (StateRecorder *recorder,VkRayTracingPipelineCreateInfoKHR *create_info,
               Hash *out_hash)

{
  VkRayTracingShaderGroupCreateInfoKHR *pVVar1;
  bool bVar2;
  VkPipelineCreateFlags2CreateInfo *pVVar3;
  VkPipelineCreateFlags2KHR VVar4;
  Hash HVar5;
  VkRayTracingShaderGroupCreateInfoKHR *group;
  uint32_t i_2;
  uint32_t i_1;
  VkPipelineShaderStageCreateInfo *stage;
  uint64_t uStack_38;
  uint32_t i;
  Hash hash;
  Hasher h;
  Hash *out_hash_local;
  VkRayTracingPipelineCreateInfoKHR *create_info_local;
  StateRecorder *recorder_local;
  
  h.h = (Hash)out_hash;
  Hasher::Hasher((Hasher *)&hash);
  pVVar3 = find_pnext<VkPipelineCreateFlags2CreateInfo>
                     (VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO,create_info->pNext);
  if (pVVar3 == (VkPipelineCreateFlags2CreateInfo *)0x0) {
    VVar4 = normalize_pipeline_creation_flags((ulong)create_info->flags);
    Hasher::u32((Hasher *)&hash,(uint32_t)VVar4);
  }
  else {
    Hasher::u32((Hasher *)&hash,0);
  }
  Hasher::u32((Hasher *)&hash,create_info->maxPipelineRayRecursionDepth);
  bVar2 = StateRecorder::get_hash_for_pipeline_layout
                    (recorder,create_info->layout,&stack0xffffffffffffffc8);
  if (!bVar2) {
    return false;
  }
  Hasher::u64((Hasher *)&hash,uStack_38);
  if (((create_info->flags & 4) == 0) || (create_info->basePipelineHandle == (VkPipeline)0x0)) {
    Hasher::u32((Hasher *)&hash,0);
  }
  else {
    bVar2 = StateRecorder::get_hash_for_raytracing_pipeline_handle
                      (recorder,create_info->basePipelineHandle,&stack0xffffffffffffffc8);
    if (!bVar2) {
      return false;
    }
    Hasher::u64((Hasher *)&hash,uStack_38);
    Hasher::s32((Hasher *)&hash,create_info->basePipelineIndex);
  }
  Hasher::u32((Hasher *)&hash,create_info->stageCount);
  for (stage._4_4_ = 0; stage._4_4_ < create_info->stageCount; stage._4_4_ = stage._4_4_ + 1) {
    bVar2 = compute_hash_stage(recorder,(Hasher *)&hash,create_info->pStages + stage._4_4_);
    if (!bVar2) {
      return false;
    }
  }
  if (create_info->pLibraryInterface == (VkRayTracingPipelineInterfaceCreateInfoKHR *)0x0) {
    Hasher::u32((Hasher *)&hash,0);
  }
  else {
    Hasher::u32((Hasher *)&hash,create_info->pLibraryInterface->maxPipelineRayHitAttributeSize);
    Hasher::u32((Hasher *)&hash,create_info->pLibraryInterface->maxPipelineRayPayloadSize);
    bVar2 = hash_pnext_chain(recorder,(Hasher *)&hash,create_info->pLibraryInterface->pNext,
                             (DynamicStateInfo *)0x0,0);
    if (!bVar2) {
      return false;
    }
  }
  if (create_info->pDynamicState == (VkPipelineDynamicStateCreateInfo *)0x0) {
    Hasher::u32((Hasher *)&hash,0);
  }
  else {
    Hasher::u32((Hasher *)&hash,create_info->pDynamicState->dynamicStateCount);
    Hasher::u32((Hasher *)&hash,create_info->pDynamicState->flags);
    for (group._4_4_ = 0; group._4_4_ < create_info->pDynamicState->dynamicStateCount;
        group._4_4_ = group._4_4_ + 1) {
      Hasher::u32((Hasher *)&hash,create_info->pDynamicState->pDynamicStates[group._4_4_]);
    }
    bVar2 = hash_pnext_chain(recorder,(Hasher *)&hash,create_info->pDynamicState->pNext,
                             (DynamicStateInfo *)0x0,0);
    if (!bVar2) {
      return false;
    }
  }
  Hasher::u32((Hasher *)&hash,create_info->groupCount);
  for (group._0_4_ = 0; (uint)group < create_info->groupCount; group._0_4_ = (uint)group + 1) {
    pVVar1 = create_info->pGroups;
    Hasher::u32((Hasher *)&hash,pVVar1[(uint)group].type);
    Hasher::u32((Hasher *)&hash,pVVar1[(uint)group].anyHitShader);
    Hasher::u32((Hasher *)&hash,pVVar1[(uint)group].closestHitShader);
    Hasher::u32((Hasher *)&hash,pVVar1[(uint)group].generalShader);
    Hasher::u32((Hasher *)&hash,pVVar1[(uint)group].intersectionShader);
    bVar2 = hash_pnext_chain(recorder,(Hasher *)&hash,pVVar1[(uint)group].pNext,
                             (DynamicStateInfo *)0x0,0);
    if (!bVar2) {
      return false;
    }
  }
  if (create_info->pLibraryInfo == (VkPipelineLibraryCreateInfoKHR *)0x0) {
    Hasher::u32((Hasher *)&hash,0);
  }
  else {
    bVar2 = hash_pnext_struct(recorder,(Hasher *)&hash,create_info->pLibraryInfo);
    if (!bVar2) {
      return false;
    }
    bVar2 = hash_pnext_chain(recorder,(Hasher *)&hash,create_info->pLibraryInfo->pNext,
                             (DynamicStateInfo *)0x0,0);
    if (!bVar2) {
      return false;
    }
  }
  bVar2 = hash_pnext_chain(recorder,(Hasher *)&hash,create_info->pNext,(DynamicStateInfo *)0x0,0);
  if (bVar2) {
    HVar5 = Hasher::get((Hasher *)&hash);
    *(Hash *)h.h = HVar5;
  }
  return bVar2;
}

Assistant:

bool compute_hash_raytracing_pipeline(const StateRecorder &recorder,
                                      const VkRayTracingPipelineCreateInfoKHR &create_info,
                                      Hash *out_hash)
{
	Hasher h;
	Hash hash;

	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, create_info.pNext))
		h.u32(0);
	else
		h.u32(normalize_pipeline_creation_flags(create_info.flags));

	h.u32(create_info.maxPipelineRayRecursionDepth);

	if (!recorder.get_hash_for_pipeline_layout(create_info.layout, &hash))
		return false;
	h.u64(hash);

	if ((create_info.flags & VK_PIPELINE_CREATE_DERIVATIVE_BIT) != 0 &&
	    create_info.basePipelineHandle != VK_NULL_HANDLE)
	{
		if (!recorder.get_hash_for_raytracing_pipeline_handle(create_info.basePipelineHandle, &hash))
			return false;
		h.u64(hash);
		h.s32(create_info.basePipelineIndex);
	}
	else
		h.u32(0);

	h.u32(create_info.stageCount);
	for (uint32_t i = 0; i < create_info.stageCount; i++)
	{
		auto &stage = create_info.pStages[i];
		if (!compute_hash_stage(recorder, h, stage))
			return false;
	}

	if (create_info.pLibraryInterface)
	{
		h.u32(create_info.pLibraryInterface->maxPipelineRayHitAttributeSize);
		h.u32(create_info.pLibraryInterface->maxPipelineRayPayloadSize);
		if (!hash_pnext_chain(&recorder, h, create_info.pLibraryInterface->pNext, nullptr, 0))
			return false;
	}
	else
		h.u32(0);

	if (create_info.pDynamicState)
	{
		h.u32(create_info.pDynamicState->dynamicStateCount);
		h.u32(create_info.pDynamicState->flags);
		for (uint32_t i = 0; i < create_info.pDynamicState->dynamicStateCount; i++)
			h.u32(create_info.pDynamicState->pDynamicStates[i]);
		if (!hash_pnext_chain(&recorder, h, create_info.pDynamicState->pNext, nullptr, 0))
			return false;
	}
	else
		h.u32(0);

	h.u32(create_info.groupCount);
	for (uint32_t i = 0; i < create_info.groupCount; i++)
	{
		auto &group = create_info.pGroups[i];
		h.u32(group.type);
		h.u32(group.anyHitShader);
		h.u32(group.closestHitShader);
		h.u32(group.generalShader);
		h.u32(group.intersectionShader);
		if (!hash_pnext_chain(&recorder, h, group.pNext, nullptr, 0))
			return false;
	}

	if (create_info.pLibraryInfo)
	{
		if (!hash_pnext_struct(&recorder, h, *create_info.pLibraryInfo))
			return false;
		if (!hash_pnext_chain(&recorder, h, create_info.pLibraryInfo->pNext, nullptr, 0))
			return false;
	}
	else
		h.u32(0);

	if (!hash_pnext_chain(&recorder, h, create_info.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}